

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

PerfEvents_Timebase * __thiscall
perfetto::protos::gen::PerfEvents_Timebase::operator=
          (PerfEvents_Timebase *this,PerfEvents_Timebase *param_1)

{
  _Head_base<0UL,_perfetto::protos::gen::PerfEvents_RawEvent_*,_false> _Var1;
  _Head_base<0UL,_perfetto::protos::gen::PerfEvents_RawEvent_*,_false> _Var2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint32_t uVar5;
  undefined4 uVar6;
  
  this->counter_ = param_1->counter_;
  uVar3 = param_1->period_;
  this->frequency_ = param_1->frequency_;
  this->period_ = uVar3;
  PerfEvents_Tracepoint::operator=
            ((this->tracepoint_).ptr_._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::PerfEvents_Tracepoint,_std::default_delete<perfetto::protos::gen::PerfEvents_Tracepoint>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::PerfEvents_Tracepoint_*,_std::default_delete<perfetto::protos::gen::PerfEvents_Tracepoint>_>
             .super__Head_base<0UL,_perfetto::protos::gen::PerfEvents_Tracepoint_*,_false>.
             _M_head_impl,
             (param_1->tracepoint_).ptr_._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::PerfEvents_Tracepoint,_std::default_delete<perfetto::protos::gen::PerfEvents_Tracepoint>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::PerfEvents_Tracepoint_*,_std::default_delete<perfetto::protos::gen::PerfEvents_Tracepoint>_>
             .super__Head_base<0UL,_perfetto::protos::gen::PerfEvents_Tracepoint_*,_false>.
             _M_head_impl);
  _Var1._M_head_impl =
       (param_1->raw_event_).ptr_._M_t.
       super___uniq_ptr_impl<perfetto::protos::gen::PerfEvents_RawEvent,_std::default_delete<perfetto::protos::gen::PerfEvents_RawEvent>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::protos::gen::PerfEvents_RawEvent_*,_std::default_delete<perfetto::protos::gen::PerfEvents_RawEvent>_>
       .super__Head_base<0UL,_perfetto::protos::gen::PerfEvents_RawEvent_*,_false>._M_head_impl;
  _Var2._M_head_impl =
       (this->raw_event_).ptr_._M_t.
       super___uniq_ptr_impl<perfetto::protos::gen::PerfEvents_RawEvent,_std::default_delete<perfetto::protos::gen::PerfEvents_RawEvent>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::protos::gen::PerfEvents_RawEvent_*,_std::default_delete<perfetto::protos::gen::PerfEvents_RawEvent>_>
       .super__Head_base<0UL,_perfetto::protos::gen::PerfEvents_RawEvent_*,_false>._M_head_impl;
  uVar5 = (_Var1._M_head_impl)->type_;
  uVar6 = *(undefined4 *)&(_Var1._M_head_impl)->field_0xc;
  uVar3 = (_Var1._M_head_impl)->config_;
  uVar4 = (_Var1._M_head_impl)->config2_;
  (_Var2._M_head_impl)->config1_ = (_Var1._M_head_impl)->config1_;
  (_Var2._M_head_impl)->config2_ = uVar4;
  (_Var2._M_head_impl)->type_ = uVar5;
  *(undefined4 *)&(_Var2._M_head_impl)->field_0xc = uVar6;
  (_Var2._M_head_impl)->config_ = uVar3;
  ::std::__cxx11::string::_M_assign((string *)&(_Var2._M_head_impl)->unknown_fields_);
  ((_Var2._M_head_impl)->_has_field_).super__Base_bitset<1UL> =
       (_Base_bitset<1UL>)((_Var1._M_head_impl)->_has_field_).super__Base_bitset<1UL>._M_w;
  this->timestamp_clock_ = param_1->timestamp_clock_;
  ::std::__cxx11::string::_M_assign((string *)&this->name_);
  ::std::__cxx11::string::_M_assign((string *)&this->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return this;
}

Assistant:

PerfEvents_Timebase::PerfEvents_Timebase(const PerfEvents_Timebase&) = default;